

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_generator_testing.h
# Opt level: O0

pair<const_phmap::priv::NonStandardLayout,_int> * __thiscall
phmap::priv::hash_internal::Generator<std::pair<const_phmap::priv::NonStandardLayout,_int>,_void>::
operator()(pair<const_phmap::priv::NonStandardLayout,_int> *__return_storage_ptr__,
          Generator<std::pair<const_phmap::priv::NonStandardLayout,_int>,_void> *this)

{
  Generator<int,_void> local_49;
  int local_48;
  Generator<phmap::priv::NonStandardLayout,_void> local_41;
  NonStandardLayout local_40;
  Generator<std::pair<const_phmap::priv::NonStandardLayout,_int>,_void> *local_18;
  Generator<std::pair<const_phmap::priv::NonStandardLayout,_int>,_void> *this_local;
  
  local_18 = this;
  this_local = (Generator<std::pair<const_phmap::priv::NonStandardLayout,_int>,_void> *)
               __return_storage_ptr__;
  Generator<phmap::priv::NonStandardLayout,_void>::operator()(&local_40,&local_41);
  local_48 = Generator<int,_void>::operator()(&local_49);
  std::pair<const_phmap::priv::NonStandardLayout,_int>::
  pair<phmap::priv::NonStandardLayout,_int,_true>(__return_storage_ptr__,&local_40,&local_48);
  NonStandardLayout::~NonStandardLayout(&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::pair<K, V> operator()() const {
        return std::pair<K, V>(Generator<typename std::decay<K>::type>()(),
                               Generator<typename std::decay<V>::type>()());
    }